

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mdns.c
# Opt level: O0

int mdns_string_equal(void *buffer_lhs,size_t size_lhs,size_t *ofs_lhs,void *buffer_rhs,
                     size_t size_rhs,size_t *ofs_rhs)

{
  size_t sVar1;
  undefined8 uVar2;
  int iVar3;
  mdns_string_pair_t local_c0;
  mdns_string_pair_t local_a8;
  size_t local_90;
  mdns_string_pair_t rhs_substr;
  mdns_string_pair_t lhs_substr;
  size_t rhs_end;
  size_t lhs_end;
  size_t rhs_cur;
  size_t lhs_cur;
  size_t *ofs_rhs_local;
  size_t size_rhs_local;
  void *buffer_rhs_local;
  size_t *ofs_lhs_local;
  size_t size_lhs_local;
  void *buffer_lhs_local;
  
  rhs_cur = *ofs_lhs;
  lhs_end = *ofs_rhs;
  rhs_end = 0xffffffffffffffff;
  lhs_substr.ref = -1;
  lhs_substr._20_4_ = 0xffffffff;
  while( true ) {
    mdns_get_next_substring(&local_a8,buffer_lhs,size_lhs,rhs_cur);
    uVar2 = local_a8._16_8_;
    sVar1 = local_a8.length;
    rhs_substr._16_8_ = local_a8.offset;
    mdns_get_next_substring(&local_c0,buffer_rhs,size_rhs,lhs_end);
    local_90 = local_c0.offset;
    rhs_substr.offset = local_c0.length;
    rhs_substr.length = local_c0._16_8_;
    if ((rhs_substr._16_8_ == -1) || (local_c0.offset == 0xffffffffffffffff)) {
      return 0;
    }
    if (sVar1 != local_c0.length) {
      return 0;
    }
    iVar3 = strncasecmp((char *)((long)buffer_rhs + local_c0.offset),
                        (char *)((long)buffer_lhs + rhs_substr._16_8_),local_c0.length);
    if (iVar3 != 0) break;
    lhs_substr.length._0_4_ = (int)uVar2;
    if (((int)lhs_substr.length != 0) && (rhs_end == 0xffffffffffffffff)) {
      rhs_end = rhs_cur + 2;
    }
    if (((int)rhs_substr.length != 0) && (lhs_substr._16_8_ == -1)) {
      lhs_substr._16_8_ = lhs_end + 2;
    }
    rhs_cur = rhs_substr._16_8_ + sVar1;
    lhs_end = local_90 + rhs_substr.offset;
    if (sVar1 == 0) {
      if (rhs_end == 0xffffffffffffffff) {
        rhs_end = rhs_cur + 1;
      }
      *ofs_lhs = rhs_end;
      if (lhs_substr._16_8_ == -1) {
        lhs_substr._16_8_ = lhs_end + 1;
      }
      *ofs_rhs = lhs_substr._16_8_;
      return 1;
    }
  }
  return 0;
}

Assistant:

int
mdns_string_equal(const void* buffer_lhs, size_t size_lhs, size_t* ofs_lhs,
                  const void* buffer_rhs, size_t size_rhs, size_t* ofs_rhs) {
	size_t lhs_cur = *ofs_lhs;
	size_t rhs_cur = *ofs_rhs;
	size_t lhs_end = MDNS_INVALID_POS;
	size_t rhs_end = MDNS_INVALID_POS;
	mdns_string_pair_t lhs_substr;
	mdns_string_pair_t rhs_substr;
	do {
		lhs_substr = mdns_get_next_substring(buffer_lhs, size_lhs, lhs_cur);
		rhs_substr = mdns_get_next_substring(buffer_rhs, size_rhs, rhs_cur);
		if ((lhs_substr.offset == MDNS_INVALID_POS) || (rhs_substr.offset == MDNS_INVALID_POS))
			return 0;
		if (lhs_substr.length != rhs_substr.length)
			return 0;
		if (strncasecmp((const char*)buffer_rhs + rhs_substr.offset,
		                (const char*)buffer_lhs + lhs_substr.offset, rhs_substr.length))
			return 0;
		if (lhs_substr.ref && (lhs_end == MDNS_INVALID_POS))
			lhs_end = lhs_cur + 2;
		if (rhs_substr.ref && (rhs_end == MDNS_INVALID_POS))
			rhs_end = rhs_cur + 2;
		lhs_cur = lhs_substr.offset + lhs_substr.length;
		rhs_cur = rhs_substr.offset + rhs_substr.length;
	}
	while (lhs_substr.length);

	if (lhs_end == MDNS_INVALID_POS)
		lhs_end = lhs_cur + 1;
	*ofs_lhs = lhs_end;

	if (rhs_end == MDNS_INVALID_POS)
		rhs_end = rhs_cur + 1;
	*ofs_rhs = rhs_end;

	return 1;
}